

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_set_diagonal(Integer g_a,Integer g_v)

{
  undefined8 uVar1;
  int iVar2;
  Integer IVar3;
  Integer icode;
  Integer IVar4;
  Integer IVar5;
  Integer IVar6;
  Integer IVar7;
  int iVar8;
  Integer IVar9;
  undefined8 *buf;
  char *pcVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  Integer IVar14;
  bool bVar15;
  char *ptr;
  Integer ld;
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer vhi;
  Integer vlo;
  Integer hiA [2];
  Integer loA [2];
  Integer local_378;
  Integer local_370;
  Integer local_368;
  Integer local_360;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar2 = _ga_sync_end;
  bVar15 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar15) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_set_diagonal_");
  pnga_check_handle(g_v,"ga_set_diagonal_");
  pnga_inquire(g_a,&atype,&andim,adims);
  icode = atype;
  pnga_inquire(g_v,&vtype,&vndim,&vdims);
  if (andim != 2) {
    pnga_error("ga_set_diagonal: wrong dimension for g_a.",andim);
  }
  if (vndim != 1) {
    pnga_error("ga_set_diagonal: wrong dimension for g_v.",vndim);
  }
  if (adims[0] < adims[1]) {
    adims[1] = adims[0];
  }
  if (vdims != adims[1]) {
    pnga_error("ga_set_diagonal: The size of the first array\'s diagonal is greater than the size of the second array."
               ,icode);
  }
  if (vtype != atype) {
    pnga_error("ga_set_diagonal: input global arrays do not have the same data type. Global array type ="
               ,atype);
  }
  pnga_local_iterator_init(g_a,&hdl);
  while (iVar8 = pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld), IVar7 = loA[1], IVar6 = loA[0],
        IVar5 = hiA[1], IVar4 = hiA[0], IVar3 = ld, pcVar10 = ptr, iVar8 != 0) {
    if (0 < loA[0]) {
      IVar14 = loA[1];
      if (loA[1] < loA[0]) {
        IVar14 = loA[0];
      }
      IVar9 = hiA[1];
      if (hiA[0] < hiA[1]) {
        IVar9 = hiA[0];
      }
      lVar13 = IVar9 - IVar14;
      if (IVar14 <= IVar9) {
        IVar9 = GAsizeof(icode);
        buf = (undefined8 *)malloc((lVar13 + 1) * IVar9);
        if (buf == (undefined8 *)0x0) {
          pnga_error("ga_set_diagonal_:failed to allocate memory for local buffer",0);
        }
        pnga_get(g_v,&vlo,&vhi,buf,&vhi);
        switch(icode) {
        case 0x3e9:
          pcVar10 = pcVar10 + (IVar14 - IVar7) * IVar3 * 4 + (IVar14 - IVar6) * 4;
          for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
            *(undefined4 *)pcVar10 = *(undefined4 *)((long)buf + lVar12 * 4);
            pcVar10 = pcVar10 + IVar3 * 4 + 4;
          }
          break;
        case 0x3ea:
          pcVar10 = pcVar10 + (IVar14 - IVar7) * IVar3 * 8 + (IVar14 - IVar6) * 8;
          for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
            *(undefined8 *)pcVar10 = buf[lVar12];
            pcVar10 = pcVar10 + IVar3 * 8 + 8;
          }
          break;
        case 0x3eb:
          pcVar10 = pcVar10 + (IVar14 - IVar7) * IVar3 * 4 + (IVar14 - IVar6) * 4;
          for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
            *(undefined4 *)pcVar10 = *(undefined4 *)((long)buf + lVar12 * 4);
            pcVar10 = pcVar10 + IVar3 * 4 + 4;
          }
          break;
        case 0x3ec:
          pcVar10 = pcVar10 + (IVar14 - IVar7) * IVar3 * 8 + (IVar14 - IVar6) * 8;
          for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
            *(undefined8 *)pcVar10 = buf[lVar12];
            pcVar10 = pcVar10 + IVar3 * 8 + 8;
          }
          break;
        default:
          pnga_error("ga_set_diagonal_: wrong data type:",icode);
          break;
        case 0x3ee:
          pcVar10 = pcVar10 + (IVar14 - IVar7) * IVar3 * 8 + (IVar14 - IVar6) * 8;
          for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
            *(undefined8 *)pcVar10 = buf[lVar12];
            pcVar10 = pcVar10 + IVar3 * 8 + 8;
          }
          break;
        case 0x3ef:
          pcVar10 = pcVar10 + (IVar14 - IVar7) * IVar3 * 0x10 + (IVar14 - IVar6) * 0x10;
          puVar11 = buf;
          for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
            uVar1 = puVar11[1];
            *(undefined8 *)pcVar10 = *puVar11;
            *(undefined8 *)(pcVar10 + 8) = uVar1;
            puVar11 = puVar11 + 2;
            pcVar10 = pcVar10 + IVar3 * 0x10 + 0x10;
          }
        }
        free(buf);
        local_368 = IVar6;
        local_360 = IVar7;
        local_378 = IVar4;
        local_370 = IVar5;
        pnga_release_update(g_a,&local_368,&local_378);
      }
    }
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_set_diagonal(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_set_diagonal_");
  pnga_check_handle (g_v, "ga_set_diagonal_");

  pnga_inquire (g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire (g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_set_diagonal: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_set_diagonal: wrong dimension for g_v.", vndim);


  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_set_diagonal: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_set_diagonal: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }

  }
#endif
  if(local_sync_end)pnga_sync();
}